

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::TextureCubeShadowCase
          (TextureCubeShadowCase *this,Context *context,char *name,char *desc,deUint32 minFilter,
          deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,deUint32 format,int size,
          deUint32 compareFunc)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 magFilter_local;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureCubeShadowCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeShadowCase_01596ac8;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_format = format;
  this->m_size = size;
  this->m_compareFunc = compareFunc;
  this->m_gradientTex = (TextureCube *)0x0;
  this->m_gridTex = (TextureCube *)0x0;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::vector(&this->m_cases);
  context_00 = Context::getRenderContext(context);
  this_00 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  this->m_caseNdx = 0;
  return;
}

Assistant:

TextureCubeShadowCase::TextureCubeShadowCase (Context& context, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 format, int size, deUint32 compareFunc)
	: TestCase			(context, name, desc)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_format			(format)
	, m_size			(size)
	, m_compareFunc		(compareFunc)
	, m_gradientTex		(DE_NULL)
	, m_gridTex			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_caseNdx			(0)
{
}